

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O3

int fits_copy_cell2image(fitsfile *fptr,fitsfile *newptr,char *colname,long rownum,int *status)

{
  int iVar1;
  long lVar2;
  long nbytes;
  long lVar3;
  int colnum;
  LONGLONG repeat;
  int typecode;
  int naxis;
  int tstatus;
  int hdutype;
  LONGLONG startpos;
  int maxelem;
  double zero;
  double scale;
  long incre;
  long twidth;
  LONGLONG tnull;
  LONGLONG rowlen;
  LONGLONG elemnum;
  char tform [20];
  char templt [81];
  LONGLONG naxes [9];
  char card [81];
  char *patterns [70] [2];
  uchar buffer [30000];
  
  templt[0x40] = '\0';
  templt[0x41] = '\0';
  templt[0x42] = '\0';
  templt[0x43] = '\0';
  templt[0x44] = '\0';
  templt[0x45] = '\0';
  templt[0x46] = '\0';
  templt[0x47] = '\0';
  templt[0x48] = '\0';
  templt[0x49] = '\0';
  templt[0x4a] = '\0';
  templt[0x4b] = '\0';
  templt[0x4c] = '\0';
  templt[0x4d] = '\0';
  templt[0x4e] = '\0';
  templt[0x4f] = '\0';
  templt[0x30] = '\0';
  templt[0x31] = '\0';
  templt[0x32] = '\0';
  templt[0x33] = '\0';
  templt[0x34] = '\0';
  templt[0x35] = '\0';
  templt[0x36] = '\0';
  templt[0x37] = '\0';
  templt[0x38] = '\0';
  templt[0x39] = '\0';
  templt[0x3a] = '\0';
  templt[0x3b] = '\0';
  templt[0x3c] = '\0';
  templt[0x3d] = '\0';
  templt[0x3e] = '\0';
  templt[0x3f] = '\0';
  templt[0x20] = '\0';
  templt[0x21] = '\0';
  templt[0x22] = '\0';
  templt[0x23] = '\0';
  templt[0x24] = '\0';
  templt[0x25] = '\0';
  templt[0x26] = '\0';
  templt[0x27] = '\0';
  templt[0x28] = '\0';
  templt[0x29] = '\0';
  templt[0x2a] = '\0';
  templt[0x2b] = '\0';
  templt[0x2c] = '\0';
  templt[0x2d] = '\0';
  templt[0x2e] = '\0';
  templt[0x2f] = '\0';
  templt[0x10] = '\0';
  templt[0x11] = '\0';
  templt[0x12] = '\0';
  templt[0x13] = '\0';
  templt[0x14] = '\0';
  templt[0x15] = '\0';
  templt[0x16] = '\0';
  templt[0x17] = '\0';
  templt[0x18] = '\0';
  templt[0x19] = '\0';
  templt[0x1a] = '\0';
  templt[0x1b] = '\0';
  templt[0x1c] = '\0';
  templt[0x1d] = '\0';
  templt[0x1e] = '\0';
  templt[0x1f] = '\0';
  templt[0] = '\0';
  templt[1] = '\0';
  templt[2] = '\0';
  templt[3] = '\0';
  templt[4] = '\0';
  templt[5] = '\0';
  templt[6] = '\0';
  templt[7] = '\0';
  templt[8] = '\0';
  templt[9] = '\0';
  templt[10] = '\0';
  templt[0xb] = '\0';
  templt[0xc] = '\0';
  templt[0xd] = '\0';
  templt[0xe] = '\0';
  templt[0xf] = '\0';
  templt[0x50] = '\0';
  memcpy(patterns,&PTR_anon_var_dwarf_15c7_001f4b00,0x460);
  if (0 < *status) {
    return *status;
  }
  iVar1 = ffgcno(fptr,0,colname,&colnum,status);
  if (iVar1 < 1) {
    iVar1 = ffgcprll(fptr,colnum,rownum,1,1,0,&scale,&zero,tform,&twidth,&typecode,&maxelem,
                     &startpos,&elemnum,&incre,&repeat,&rowlen,&hdutype,&tnull,(char *)buffer,status
                    );
    if (0 < iVar1) goto LAB_0010bc0c;
    ffkeyn("",colnum,templt,&tstatus);
    ffgcnn(fptr,0,templt,colname,&colnum,&tstatus);
    if (hdutype != 2) {
      ffpmsg("This extension is not a binary table.");
      ffpmsg(" Cannot open the image in a binary table cell.");
      *status = 0xe3;
      return 0xe3;
    }
    if (typecode < 0) {
      typecode = -typecode;
      naxis = 1;
      naxes[0] = repeat;
    }
    else {
      ffgtdmll(fptr,colnum,9,&naxis,naxes,status);
    }
    if (*status < 1) {
      if (typecode < 0x29) {
        if ((typecode == 0xb) || (typecode == 0xe)) {
          iVar1 = 8;
          lVar2 = repeat;
        }
        else {
          if (typecode != 0x15) goto LAB_0010bd56;
          iVar1 = 0x10;
          lVar2 = repeat * 2;
        }
      }
      else if (typecode < 0x51) {
        if (typecode == 0x29) {
          iVar1 = 0x20;
          lVar2 = repeat << 2;
        }
        else {
          if (typecode != 0x2a) {
LAB_0010bd56:
            ffpmsg("Error: the following image column has invalid datatype:");
            ffpmsg(colname);
            ffpmsg(tform);
            ffpmsg("Cannot open an image in a single row of this column.");
            *status = 0x105;
            return 0x105;
          }
          iVar1 = -0x20;
          lVar2 = repeat << 2;
        }
      }
      else if (typecode == 0x51) {
        iVar1 = 0x40;
        lVar2 = repeat << 3;
      }
      else {
        if (typecode != 0x52) goto LAB_0010bd56;
        iVar1 = -0x40;
        lVar2 = repeat << 3;
      }
      iVar1 = ffcrimll(newptr,iVar1,naxis,naxes,status);
      if (iVar1 < 1) {
        fits_translate_keywords(fptr,newptr,9,patterns,0x46,colnum,0,0,status);
        snprintf(card,0x51,"HISTORY  This image was copied from row %ld of column \'%s\',",rownum,
                 colname);
        ffflsh(fptr,0,status);
        ffmbyt(fptr,startpos,1,status);
        lVar3 = 30000;
        if (lVar2 < 30000) {
          lVar3 = lVar2;
        }
        ffgbyt(fptr,lVar3,buffer,status);
        ffptbb(newptr,1,1,lVar3,buffer,status);
        lVar2 = lVar2 - lVar3;
        if (lVar2 != 0) {
          lVar3 = lVar3 + 1;
          do {
            if (0 < *status) break;
            nbytes = 30000;
            if (lVar2 < 30000) {
              nbytes = lVar2;
            }
            ffread(fptr->Fptr,nbytes,buffer,status);
            ffptbb(newptr,1,lVar3,nbytes,buffer,status);
            lVar3 = lVar3 + nbytes;
            lVar2 = lVar2 - nbytes;
          } while (lVar2 != 0);
        }
        ffrdef(newptr,status);
        goto LAB_0010bc0c;
      }
      colname = "failed to write required primary array keywords in the output file";
    }
    else {
      colname = "Error getting the dimensions of the image";
    }
  }
  else {
    ffpmsg("column containing image in table cell does not exist:");
  }
  ffpmsg(colname);
LAB_0010bc0c:
  return *status;
}

Assistant:

int fits_copy_cell2image(
	   fitsfile *fptr,   /* I - point to input table */
	   fitsfile *newptr, /* O - existing output file; new image HDU
				    will be appended to it */
           char *colname,    /* I - column name / number containing the image*/
           long rownum,      /* I - number of the row containing the image */
           int *status)      /* IO - error status */

/*
  Copy a table cell of a given row and column into an image extension.
  The output file must already have been created.  A new image
  extension will be created in that file.
  
  This routine was written by Craig Markwardt, GSFC
*/

{
    unsigned char buffer[30000];
    int hdutype, colnum, typecode, bitpix, naxis, maxelem, tstatus;
    LONGLONG naxes[9], nbytes, firstbyte, ntodo;
    LONGLONG repeat, startpos, elemnum, rowlen, tnull;
    long twidth, incre;
    double scale, zero;
    char tform[20];
    char card[FLEN_CARD];
    char templt[FLEN_CARD] = "";

    /* Table-to-image keyword translation table  */
    /*                        INPUT      OUTPUT  */
    /*                       01234567   01234567 */
    char *patterns[][2] = {{"TSCALn",  "BSCALE"  },  /* Standard FITS keywords */
			   {"TZEROn",  "BZERO"   },
			   {"TUNITn",  "BUNIT"   },
			   {"TNULLn",  "BLANK"   },
			   {"TDMINn",  "DATAMIN" },
			   {"TDMAXn",  "DATAMAX" },
			   {"iCTYPn",  "CTYPEi"  },  /* Coordinate labels */
			   {"iCTYna",  "CTYPEia" },
			   {"iCUNIn",  "CUNITi"  },  /* Coordinate units */
			   {"iCUNna",  "CUNITia" },
			   {"iCRVLn",  "CRVALi"  },  /* WCS keywords */
			   {"iCRVna",  "CRVALia" },
			   {"iCDLTn",  "CDELTi"  },
			   {"iCDEna",  "CDELTia" },
			   {"iCRPXn",  "CRPIXi"  },
			   {"iCRPna",  "CRPIXia" },
			   {"ijPCna",  "PCi_ja"  },
			   {"ijCDna",  "CDi_ja"  },
			   {"iVn_ma",  "PVi_ma"  },
			   {"iSn_ma",  "PSi_ma"  },
			   {"iCRDna",  "CRDERia" },
			   {"iCSYna",  "CSYERia" },
			   {"iCROTn",  "CROTAi"  },
			   {"WCAXna",  "WCSAXESa"},
			   {"WCSNna",  "WCSNAMEa"},

			   {"LONPna",  "LONPOLEa"},
			   {"LATPna",  "LATPOLEa"},
			   {"EQUIna",  "EQUINOXa"},
			   {"MJDOBn",  "MJD-OBS" },
			   {"MJDAn",   "MJD-AVG" },
			   {"RADEna",  "RADESYSa"},
			   {"iCNAna",  "CNAMEia" },
			   {"DAVGn",   "DATE-AVG"},

                           /* Delete table keywords related to other columns */
			   {"T????#a", "-"       }, 
 			   {"TC??#a",  "-"       },
 			   {"TWCS#a",  "-"       },
			   {"TDIM#",   "-"       }, 
			   {"iCTYPm",  "-"       },
			   {"iCUNIm",  "-"       },
			   {"iCRVLm",  "-"       },
			   {"iCDLTm",  "-"       },
			   {"iCRPXm",  "-"       },
			   {"iCTYma",  "-"       },
			   {"iCUNma",  "-"       },
			   {"iCRVma",  "-"       },
			   {"iCDEma",  "-"       },
			   {"iCRPma",  "-"       },
			   {"ijPCma",  "-"       },
			   {"ijCDma",  "-"       },
			   {"iVm_ma",  "-"       },
			   {"iSm_ma",  "-"       },
			   {"iCRDma",  "-"       },
			   {"iCSYma",  "-"       },
			   {"iCROTm",  "-"       },
			   {"WCAXma",  "-"       },
			   {"WCSNma",  "-"       },

			   {"LONPma",  "-"       },
			   {"LATPma",  "-"       },
			   {"EQUIma",  "-"       },
			   {"MJDOBm",  "-"       },
			   {"MJDAm",   "-"       },
			   {"RADEma",  "-"       },
			   {"iCNAma",  "-"       },
			   {"DAVGm",   "-"       },

			   {"EXTNAME", "-"       },  /* Remove structural keywords*/
			   {"EXTVER",  "-"       },
			   {"EXTLEVEL","-"       },
			   {"CHECKSUM","-"       },
			   {"DATASUM", "-"       },
			   
			   {"*",       "+"       }}; /* copy all other keywords */
    int npat;

    if (*status > 0)
        return(*status);

    /* get column number */
    if (ffgcno(fptr, CASEINSEN, colname, &colnum, status) > 0)
    {
        ffpmsg("column containing image in table cell does not exist:");
        ffpmsg(colname);
        return(*status);
    }

    /*---------------------------------------------------*/
    /*  Check input and get parameters about the column: */
    /*---------------------------------------------------*/
    if ( ffgcprll(fptr, colnum, rownum, 1L, 1L, 0, &scale, &zero,
         tform, &twidth, &typecode, &maxelem, &startpos, &elemnum, &incre,
         &repeat, &rowlen, &hdutype, &tnull, (char *) buffer, status) > 0 )
         return(*status);

     /* get the actual column name, in case a column number was given */
    ffkeyn("", colnum, templt, &tstatus);
    ffgcnn(fptr, CASEINSEN, templt, colname, &colnum, &tstatus);

    if (hdutype != BINARY_TBL)
    {
        ffpmsg("This extension is not a binary table.");
        ffpmsg(" Cannot open the image in a binary table cell.");
        return(*status = NOT_BTABLE);
    }

    if (typecode < 0)
    {
        /* variable length array */
        typecode *= -1;  

        /* variable length arrays are 1-dimensional by default */
        naxis = 1;
        naxes[0] = repeat;
    }
    else
    {
        /* get the dimensions of the image */
        ffgtdmll(fptr, colnum, 9, &naxis, naxes, status);
    }

    if (*status > 0)
    {
        ffpmsg("Error getting the dimensions of the image");
        return(*status);
    }

    /* determine BITPIX value for the image */
    if (typecode == TBYTE)
    {
        bitpix = BYTE_IMG;
        nbytes = repeat;
    }
    else if (typecode == TSHORT)
    {
        bitpix = SHORT_IMG;
        nbytes = repeat * 2;
    }
    else if (typecode == TLONG)
    {
        bitpix = LONG_IMG;
        nbytes = repeat * 4;
    }
    else if (typecode == TFLOAT)
    {
        bitpix = FLOAT_IMG;
        nbytes = repeat * 4;
    }
    else if (typecode == TDOUBLE)
    {
        bitpix = DOUBLE_IMG;
        nbytes = repeat * 8;
    }
    else if (typecode == TLONGLONG)
    {
        bitpix = LONGLONG_IMG;
        nbytes = repeat * 8;
    }
    else if (typecode == TLOGICAL)
    {
        bitpix = BYTE_IMG;
        nbytes = repeat;
    }
    else
    {
        ffpmsg("Error: the following image column has invalid datatype:");
        ffpmsg(colname);
        ffpmsg(tform);
        ffpmsg("Cannot open an image in a single row of this column.");
        return(*status = BAD_TFORM);
    }

    /* create new image in output file */
    if (ffcrimll(newptr, bitpix, naxis, naxes, status) > 0)
    {
        ffpmsg("failed to write required primary array keywords in the output file");
        return(*status);
    }

    npat = sizeof(patterns)/sizeof(patterns[0][0])/2;
    
    /* skip over the first 8 keywords, starting just after TFIELDS */
    fits_translate_keywords(fptr, newptr, 9, patterns, npat,
			    colnum, 0, 0, status);

    /* add some HISTORY  */
    snprintf(card,FLEN_CARD,"HISTORY  This image was copied from row %ld of column '%s',",
            rownum, colname);
/* disable this; leave it up to the caller to write history if needed.    
    ffprec(newptr, card, status);
*/
    /* the use of ffread routine, below, requires that any 'dirty' */
    /* buffers in memory be flushed back to the file first */
    
    ffflsh(fptr, FALSE, status);

    /* finally, copy the data, one buffer size at a time */
    ffmbyt(fptr, startpos, TRUE, status);
    firstbyte = 1; 

    /* the upper limit on the number of bytes must match the declaration */
    /* read up to the first 30000 bytes in the normal way with ffgbyt */

    ntodo = minvalue(30000, nbytes);
    ffgbyt(fptr, ntodo, buffer, status);
    ffptbb(newptr, 1, firstbyte, ntodo, buffer, status);

    nbytes    -= ntodo;
    firstbyte += ntodo;

    /* read any additional bytes with low-level ffread routine, for speed */
    while (nbytes && (*status <= 0) )
    {
        ntodo = minvalue(30000, nbytes);
        ffread((fptr)->Fptr, (long) ntodo, buffer, status);
        ffptbb(newptr, 1, firstbyte, ntodo, buffer, status);
        nbytes    -= ntodo;
        firstbyte += ntodo;
    }

    /* Re-scan the header so that CFITSIO knows about all the new keywords */
    ffrdef(newptr,status);

    return(*status);
}